

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlgl.h
# Opt level: O0

void rlSetUniform(int locIndex,void *value,int uniformType,int count)

{
  int count_local;
  int uniformType_local;
  void *value_local;
  int locIndex_local;
  
  switch(uniformType) {
  case 0:
    (*glad_glUniform1fv)(locIndex,count,(GLfloat *)value);
    break;
  case 1:
    (*glad_glUniform2fv)(locIndex,count,(GLfloat *)value);
    break;
  case 2:
    (*glad_glUniform3fv)(locIndex,count,(GLfloat *)value);
    break;
  case 3:
    (*glad_glUniform4fv)(locIndex,count,(GLfloat *)value);
    break;
  case 4:
    (*glad_glUniform1iv)(locIndex,count,(GLint *)value);
    break;
  case 5:
    (*glad_glUniform2iv)(locIndex,count,(GLint *)value);
    break;
  case 6:
    (*glad_glUniform3iv)(locIndex,count,(GLint *)value);
    break;
  case 7:
    (*glad_glUniform4iv)(locIndex,count,(GLint *)value);
    break;
  case 8:
    (*glad_glUniform1iv)(locIndex,count,(GLint *)value);
    break;
  default:
    TraceLog(4,"SHADER: Failed to set uniform value, data type not recognized");
  }
  return;
}

Assistant:

void rlSetUniform(int locIndex, const void *value, int uniformType, int count)
{
#if defined(GRAPHICS_API_OPENGL_33) || defined(GRAPHICS_API_OPENGL_ES2)
    switch (uniformType)
    {
        case SHADER_UNIFORM_FLOAT: glUniform1fv(locIndex, count, (float *)value); break;
        case SHADER_UNIFORM_VEC2: glUniform2fv(locIndex, count, (float *)value); break;
        case SHADER_UNIFORM_VEC3: glUniform3fv(locIndex, count, (float *)value); break;
        case SHADER_UNIFORM_VEC4: glUniform4fv(locIndex, count, (float *)value); break;
        case SHADER_UNIFORM_INT: glUniform1iv(locIndex, count, (int *)value); break;
        case SHADER_UNIFORM_IVEC2: glUniform2iv(locIndex, count, (int *)value); break;
        case SHADER_UNIFORM_IVEC3: glUniform3iv(locIndex, count, (int *)value); break;
        case SHADER_UNIFORM_IVEC4: glUniform4iv(locIndex, count, (int *)value); break;
        case SHADER_UNIFORM_SAMPLER2D: glUniform1iv(locIndex, count, (int *)value); break;
        default: TRACELOG(LOG_WARNING, "SHADER: Failed to set uniform value, data type not recognized");
    }
#endif
}